

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  slot_type *psVar5;
  uint64_t uVar6;
  bool bVar7;
  slot_type *psVar8;
  ulong uVar9;
  iterator iVar10;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)(kEmptyGroup + 0x10) || psVar1 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 != (slot_type *)(kEmptyGroup + 0x10) && psVar2 != (slot_type *)0x0) &&
       (*(ctrl_t *)psVar2 < ~kSentinel)) goto LAB_001f41a0;
    if (psVar1 == (slot_type *)(kEmptyGroup + 0x10) && psVar2 == (slot_type *)(kEmptyGroup + 0x10))
    {
LAB_001f4193:
      return psVar1 == psVar2;
    }
    if ((psVar1 == (slot_type *)(kEmptyGroup + 0x10)) ==
        (psVar2 == (slot_type *)(kEmptyGroup + 0x10))) {
      if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_001f4193;
      if ((psVar2 == (slot_type *)kSooControl) == (psVar1 == (slot_type *)kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar3 = (b->field_1).slot_;
        if (psVar1 == (slot_type *)kSooControl) {
          bVar7 = (slot_type *)a == psVar3;
        }
        else {
          psVar8 = psVar3;
          psVar4 = psVar2;
          psVar5 = (slot_type *)a;
          if (psVar2 < psVar1) {
            psVar8 = (slot_type *)a;
            psVar4 = psVar1;
            psVar5 = psVar3;
          }
          b = (iterator *)CONCAT71((int7)((ulong)psVar4 >> 8),psVar4 < psVar5);
          bVar7 = psVar5 <= psVar8 && psVar4 < psVar5;
        }
        if (bVar7) goto LAB_001f4193;
      }
      goto LAB_001f41aa;
    }
  }
  else {
    operator==();
LAB_001f41a0:
    operator==();
  }
  operator==();
LAB_001f41aa:
  operator==();
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              *)a);
  uVar9 = ((key_arg<std::__cxx11::basic_string<char>_> *)b)->_M_string_length;
  uVar6 = hash_internal::MixingHashState::CombineContiguousImpl
                    (&hash_internal::MixingHashState::kSeed,
                     (((key_arg<std::__cxx11::basic_string<char>_> *)b)->_M_dataplus)._M_p,uVar9);
  uVar9 = (uVar9 ^ uVar6) * -0x234dd359734ecb13;
  iVar10 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
           ::find_non_soo<std::__cxx11::string>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
                       *)a,(key_arg<std::__cxx11::basic_string<char>_> *)b,
                      uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
  return iVar10.ctrl_._0_1_;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }